

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void __thiscall
EthBasePort::make_bwrite_packet
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,quadlet_t *data,
          uint nBytes,uint tl)

{
  quadlet_t *__dest;
  uint32_t uVar1;
  
  make_1394_header(this,packet,node,addr,1,tl);
  packet[3] = ((nBytes & 0xff00) << 8 | nBytes << 0x18) >> 0x10;
  uVar1 = crc32(0,packet,0x10);
  uVar1 = BitReverse32(uVar1);
  packet[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  __dest = packet + 5;
  if (__dest != data) {
    (this->super_BasePort).rtWrite = false;
    memcpy(__dest,data,(ulong)nBytes);
  }
  uVar1 = crc32(0,__dest,(ulong)nBytes);
  uVar1 = BitReverse32(uVar1);
  *(uint32_t *)((long)packet + (ulong)(nBytes & 0xfffffffc) + 0x14) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return;
}

Assistant:

void EthBasePort::make_bwrite_packet(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, quadlet_t *data, unsigned int nBytes, unsigned int tl)
{
    make_1394_header(packet, node, addr, EthBasePort::BWRITE, tl);
    // block length
    packet[3] = bswap_32((nBytes & 0x0000ffff) << 16);
    // header CRC
    packet[4] = bswap_32(BitReverse32(crc32(0U, (void*)packet, FW_BWRITE_HEADER_SIZE-FW_CRC_SIZE)));
    // Now, copy the data. We first check if the copy is needed.
    size_t data_offset = FW_BWRITE_HEADER_SIZE/sizeof(quadlet_t);  // data_offset = 20/4 = 5
    // Only copy data if it is not already in packet (i.e., if addresses are not equal).
    if (data != &packet[data_offset]) {
        rtWrite = false;
        memcpy(&packet[data_offset], data, nBytes);
    }
    // Now, compute the data CRC (assumes nBytes is a multiple of 4 because this is checked in WriteBlock)
    size_t data_crc_offset = data_offset + nBytes/sizeof(quadlet_t);
    packet[data_crc_offset] = bswap_32(BitReverse32(crc32(0U, static_cast<void *>(packet+data_offset), nBytes)));
#if 0 // ALTERNATIVE IMPLEMENTATION
    // CRC
    quadlet_t *fw_crc = fw_data + (nbytes/sizeof(quadlet_t));
    *fw_crc = bswap_32(BitReverse32(crc32(0U, (void*)fw_data, nbytes)));
#endif
}